

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

void __thiscall LruHash<TldAsKey>::LruUnlink(LruHash<TldAsKey> *this,TldAsKey *key)

{
  TldAsKey *pTVar1;
  TldAsKey *pTVar2;
  LruHash<TldAsKey> *pLVar3;
  
  if (key != (TldAsKey *)0x0) {
    pTVar1 = key->MoreRecentKey;
    pTVar2 = key->LessRecentKey;
    pLVar3 = (LruHash<TldAsKey> *)&pTVar1->LessRecentKey;
    if (pTVar1 == (TldAsKey *)0x0) {
      pLVar3 = this;
    }
    pLVar3->MostRecentlyUsed = pTVar2;
    if (pTVar2 == (TldAsKey *)0x0) {
      pTVar2 = (TldAsKey *)this;
    }
    pTVar2->MoreRecentKey = pTVar1;
    key->MoreRecentKey = (TldAsKey *)0x0;
    key->LessRecentKey = (TldAsKey *)0x0;
  }
  return;
}

Assistant:

void LruUnlink(KeyObj * key)
    {
        if (key != NULL)
        {
            /* If the object was newly created, the more and less recent keys should be NULL */

            if (key->MoreRecentKey != NULL)
            {
                key->MoreRecentKey->LessRecentKey = key->LessRecentKey;
            }
            else
            {
                MostRecentlyUsed = key->LessRecentKey;
            }

            if (key->LessRecentKey != NULL)
            {
                key->LessRecentKey->MoreRecentKey = key->MoreRecentKey;
            }
            else
            {
                LeastRecentlyUsed = key->MoreRecentKey;
            }

            key->MoreRecentKey = NULL;
            key->LessRecentKey = NULL;
        }
    }